

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFMatrix.cc
# Opt level: O1

Rectangle * __thiscall
QPDFMatrix::transformRectangle(Rectangle *__return_storage_ptr__,QPDFMatrix *this,Rectangle r)

{
  double dVar1;
  double dVar2;
  double dVar3;
  value_type_conflict5 *__val_1;
  double *pdVar4;
  double *pdVar5;
  long lVar6;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> __result;
  double *pdVar7;
  double *pdVar8;
  value_type_conflict5 *__val;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  
  pdVar4 = (double *)operator_new(0x20);
  *pdVar4 = 0.0;
  pdVar4[1] = 0.0;
  pdVar4[2] = 0.0;
  pdVar4[3] = 0.0;
  pdVar5 = (double *)operator_new(0x20);
  pdVar5[2] = 0.0;
  pdVar5[3] = 0.0;
  *pdVar5 = 0.0;
  pdVar5[1] = 0.0;
  dVar1 = this->a;
  dVar9 = this->c;
  dVar13 = r.lly * dVar9;
  dVar15 = dVar1 * r.llx;
  dVar2 = this->e;
  *pdVar4 = dVar15 + dVar13 + dVar2;
  dVar11 = this->b;
  dVar12 = this->d;
  dVar10 = r.lly * dVar12;
  dVar14 = r.llx * dVar11;
  dVar3 = this->f;
  *pdVar5 = dVar14 + dVar10 + dVar3;
  dVar9 = dVar9 * r.ury;
  pdVar4[1] = dVar15 + dVar9 + dVar2;
  dVar12 = dVar12 * r.ury;
  pdVar5[1] = dVar14 + dVar12 + dVar3;
  dVar1 = dVar1 * r.urx;
  pdVar4[2] = dVar13 + dVar1 + dVar2;
  dVar11 = dVar11 * r.urx;
  pdVar5[2] = dVar10 + dVar11 + dVar3;
  pdVar4[3] = dVar1 + dVar9 + dVar2;
  pdVar5[3] = dVar11 + dVar12 + dVar3;
  lVar6 = 8;
  pdVar7 = pdVar4;
  do {
    if (*(double *)((long)pdVar4 + lVar6) <= *pdVar7 && *pdVar7 != *(double *)((long)pdVar4 + lVar6)
       ) {
      pdVar7 = (double *)((long)pdVar4 + lVar6);
    }
    lVar6 = lVar6 + 8;
  } while (lVar6 != 0x20);
  lVar6 = 8;
  pdVar8 = pdVar5;
  do {
    if (*(double *)((long)pdVar5 + lVar6) <= *pdVar8 && *pdVar8 != *(double *)((long)pdVar5 + lVar6)
       ) {
      pdVar8 = (double *)((long)pdVar5 + lVar6);
    }
    lVar6 = lVar6 + 8;
  } while (lVar6 != 0x20);
  dVar1 = *pdVar8;
  lVar6 = 8;
  pdVar8 = pdVar4;
  do {
    if (*pdVar8 <= *(double *)((long)pdVar4 + lVar6) && *(double *)((long)pdVar4 + lVar6) != *pdVar8
       ) {
      pdVar8 = (double *)((long)pdVar4 + lVar6);
    }
    lVar6 = lVar6 + 8;
  } while (lVar6 != 0x20);
  dVar9 = *pdVar8;
  lVar6 = 8;
  pdVar8 = pdVar5;
  do {
    if (*pdVar8 <= *(double *)((long)pdVar5 + lVar6) && *(double *)((long)pdVar5 + lVar6) != *pdVar8
       ) {
      pdVar8 = (double *)((long)pdVar5 + lVar6);
    }
    lVar6 = lVar6 + 8;
  } while (lVar6 != 0x20);
  dVar2 = *pdVar8;
  __return_storage_ptr__->llx = *pdVar7;
  __return_storage_ptr__->lly = dVar1;
  __return_storage_ptr__->urx = dVar9;
  __return_storage_ptr__->ury = dVar2;
  operator_delete(pdVar5,0x20);
  operator_delete(pdVar4,0x20);
  return __return_storage_ptr__;
}

Assistant:

QPDFObjectHandle::Rectangle
QPDFMatrix::transformRectangle(QPDFObjectHandle::Rectangle r) const
{
    std::vector<double> tx(4);
    std::vector<double> ty(4);
    transform(r.llx, r.lly, tx.at(0), ty.at(0));
    transform(r.llx, r.ury, tx.at(1), ty.at(1));
    transform(r.urx, r.lly, tx.at(2), ty.at(2));
    transform(r.urx, r.ury, tx.at(3), ty.at(3));
    return {
        *std::min_element(tx.begin(), tx.end()),
        *std::min_element(ty.begin(), ty.end()),
        *std::max_element(tx.begin(), tx.end()),
        *std::max_element(ty.begin(), ty.end())};
}